

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

bool __thiscall
semver::detail::token_stream::advanceIfMatch(token_stream *this,token *token,token_type type)

{
  token_type tVar1;
  token *ptVar2;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  
  tVar1 = (this->tokens).
          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
          super__Vector_impl_data._M_start[this->current].type;
  if (tVar1 == type) {
    ptVar2 = advance(this);
    *(token **)token = ptVar2;
    token->lexeme = (char *)CONCAT44(extraout_var,extraout_EDX);
  }
  return tVar1 == type;
}

Assistant:

SEMVER_CONSTEXPR bool advanceIfMatch(token& token, token_type type) noexcept {
    if (get(current).type != type) {
      return false;
    }

    token = advance();
    return true;
  }